

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O1

void __thiscall OpenMD::SimInfo::calcNdfTrans(SimInfo *this)

{
  this->ndfTrans_ =
       ((this->nIntegrableObjects_ * 3 - this->nConstraints_) - this->nZconstraint_) + -3;
  return;
}

Assistant:

void SimInfo::calcNdfTrans() {
    int ndfTrans_local;

    ndfTrans_local = 3 * nIntegrableObjects_ - nConstraints_;

#ifdef IS_MPI
    MPI_Allreduce(&ndfTrans_local, &ndfTrans_, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#else
    ndfTrans_                  = ndfTrans_local;
#endif

    ndfTrans_ = ndfTrans_ - 3 - nZconstraint_;
  }